

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Watcher.cpp
# Opt level: O1

void __thiscall xmrig::Watcher::Watcher(Watcher *this,String *path,IWatcherListener *listener)

{
  Timer *this_00;
  uv_fs_event_t *puVar1;
  undefined8 uVar2;
  
  (this->super_ITimerListener)._vptr_ITimerListener = (_func_int **)&PTR__Watcher_001ae6a0;
  this->m_listener = listener;
  String::String(&this->m_path,path);
  this_00 = (Timer *)operator_new(0x10);
  Timer::Timer(this_00,&this->super_ITimerListener);
  this->m_timer = this_00;
  puVar1 = (uv_fs_event_t *)operator_new(0x88);
  this->m_fsEvent = puVar1;
  puVar1->data = this;
  uVar2 = uv_default_loop();
  uv_fs_event_init(uVar2,this->m_fsEvent);
  uv_fs_event_start(this->m_fsEvent,onFsEvent,(this->m_path).m_data,0);
  return;
}

Assistant:

xmrig::Watcher::Watcher(const String &path, IWatcherListener *listener) :
    m_listener(listener),
    m_path(path)
{
    m_timer = new Timer(this);

    m_fsEvent = new uv_fs_event_t;
    m_fsEvent->data = this;
    uv_fs_event_init(uv_default_loop(), m_fsEvent);

    start();
}